

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPIConfigureLog.cxx
# Opt level: O1

Value * cmFileAPIConfigureLogDump
                  (Value *__return_storage_ptr__,cmFileAPI *fileAPI,unsigned_long version)

{
  string *psVar1;
  Value *pVVar2;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  ValueHolder local_90;
  pointer local_88;
  undefined8 local_80;
  undefined8 local_78;
  char *local_70;
  undefined8 local_68;
  Value local_60;
  string local_38;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  psVar1 = cmake::GetHomeOutputDirectory_abi_cxx11_(fileAPI->CMakeInstance);
  local_88 = (psVar1->_M_dataplus)._M_p;
  local_90 = (ValueHolder)psVar1->_M_string_length;
  local_80 = 0;
  local_78 = 0x22;
  local_70 = "/CMakeFiles/CMakeConfigureLog.yaml";
  local_68 = 0;
  views._M_len = 2;
  views._M_array = (iterator)&local_90;
  cmCatViews(&local_38,views);
  Json::Value::Value(&local_60,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"path");
  Json::Value::operator=(pVVar2,&local_60);
  Json::Value::~Value(&local_60);
  Json::Value::Value(&local_60,arrayValue);
  if (version == 1) {
    Json::Value::Value((Value *)&local_90,"message-v1");
    Json::Value::append(&local_60,(Value *)&local_90);
    Json::Value::~Value((Value *)&local_90);
    Json::Value::Value((Value *)&local_90,"try_compile-v1");
    Json::Value::append(&local_60,(Value *)&local_90);
    Json::Value::~Value((Value *)&local_90);
    Json::Value::Value((Value *)&local_90,"try_run-v1");
    Json::Value::append(&local_60,(Value *)&local_90);
    Json::Value::~Value((Value *)&local_90);
  }
  pVVar2 = Json::Value::operator[](__return_storage_ptr__,"eventKindNames");
  Json::Value::operator=(pVVar2,&local_60);
  Json::Value::~Value(&local_60);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPIConfigureLogDump(cmFileAPI& fileAPI,
                                      unsigned long version)
{
  ConfigureLog configureLog(fileAPI, version);
  return configureLog.Dump();
}